

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryAny(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_64_8_c3546e6f handler;
  bool bVar2;
  int n;
  CallFlags e;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptError *pError_00;
  RecyclableObject *local_200;
  JavascriptExceptionObject *exception_1;
  JavascriptException *err_1;
  JavascriptError *pError;
  undefined4 local_134;
  code *pcStack_130;
  uint32 index;
  undefined8 local_128;
  TrackAllocData local_120;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *local_f8;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElementsWrapper;
  JavascriptArray *errors;
  JavascriptExceptionObject *exception;
  JavascriptException *err;
  Var iterable;
  Var resolveVar;
  RecyclableObject *iteratorRecord;
  RecyclableObject *promiseResolve;
  JavascriptLibrary *library;
  RecyclableObject *constructor;
  JavascriptPromiseCapability *promiseCapability;
  Var local_88;
  Var C;
  undefined1 local_78 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x112,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x113,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  C = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_78,function,(CallInfo)function_local,L"Promise.any",
             &stack0x00000000);
  local_88 = Arguments::operator[]((Arguments *)&scriptContext,0);
  constructor = (RecyclableObject *)NewPromiseCapability(local_88,(ScriptContext *)__tag.entry.next)
  ;
  library = (JavascriptLibrary *)UnsafeVarTo<Js::RecyclableObject>(local_88);
  promiseResolve = (RecyclableObject *)ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
  iteratorRecord = (RecyclableObject *)0x0;
  resolveVar = (Var)0x0;
  iterable = Js::JavascriptOperators::GetProperty
                       ((RecyclableObject *)library,0x134,(ScriptContext *)__tag.entry.next,
                        (PropertyValueInfo *)0x0);
  bVar2 = JavascriptConversion::IsCallable(iterable);
  if (!bVar2) {
    JavascriptError::ThrowTypeError((ScriptContext *)__tag.entry.next,-0x7ff5ec76,(PCWSTR)0x0);
  }
  iteratorRecord = UnsafeVarTo<Js::RecyclableObject>(iterable);
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    local_200 = JavascriptLibraryBase::GetUndefined((JavascriptLibraryBase *)promiseResolve);
  }
  else {
    local_200 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  err = (JavascriptException *)local_200;
  resolveVar = Js::JavascriptOperators::GetIterator
                         (local_200,(ScriptContext *)__tag.entry.next,false);
  remainingElementsWrapper =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
       JavascriptLibrary::CreateArray((JavascriptLibrary *)promiseResolve);
  pRVar5 = ScriptContext::GetRecycler((ScriptContext *)__tag.entry.next);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_120,
             (type_info *)
             &JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0x142);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_120);
  pcStack_130 = Memory::Recycler::AllocZeroInlined;
  local_128 = 0;
  local_f8 = (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
             new<Memory::Recycler>(4,pRVar5,0x744a10);
  local_f8->remainingElements = 1;
  local_134 = 0;
  handler.library = (JavascriptLibrary **)&promiseResolve;
  handler.errors = (JavascriptArray **)&remainingElementsWrapper;
  handler.scriptContext = (ScriptContext **)&__tag.entry.next;
  handler.promiseResolve = &iteratorRecord;
  handler.constructor = (RecyclableObject **)&library;
  handler.index = &local_134;
  handler.promiseCapability = (JavascriptPromiseCapability **)&constructor;
  handler.remainingElementsWrapper = &local_f8;
  Js::JavascriptOperators::
  DoIteratorStepAndValue<Js::JavascriptPromise::EntryAny(Js::RecyclableObject*,Js::CallInfo,___)::__0>
            ((RecyclableObject *)resolveVar,(ScriptContext *)__tag.entry.next,handler);
  local_f8->remainingElements = local_f8->remainingElements - 1;
  if (local_f8->remainingElements == 0) {
    pError_00 = JavascriptLibrary::CreateAggregateError((JavascriptLibrary *)promiseResolve);
    JavascriptError::SetErrorsList
              (pError_00,(JavascriptArray *)remainingElementsWrapper,
               (ScriptContext *)__tag.entry.next);
    JavascriptError::SetErrorMessage(pError_00,-0x7ff5ea0a,L"",(ScriptContext *)__tag.entry.next);
    JavascriptExceptionOperators::Throw(pError_00,(ScriptContext *)__tag.entry.next);
  }
  callInfo_local =
       (CallInfo)JavascriptPromiseCapability::GetPromise((JavascriptPromiseCapability *)constructor)
  ;
  errors._4_4_ = 1;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_78);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptPromise::EntryAny(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.any"));

        // 1. Let C be the this value.
        Var C = args[0];

        // 2. Let promiseCapability be ? NewPromiseCapability(C).
        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(C, scriptContext);
        RecyclableObject* constructor = UnsafeVarTo<RecyclableObject>(C);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        RecyclableObject* promiseResolve = nullptr;
        RecyclableObject* iteratorRecord = nullptr;
        try {
            // 3. Let promiseResolve be GetPromiseResolve(C).
            // 4. IfAbruptRejectPromise(promiseResolve, promiseCapability).
            Var resolveVar = JavascriptOperators::GetProperty(constructor, Js::PropertyIds::resolve, scriptContext);
            if (!JavascriptConversion::IsCallable(resolveVar))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
            }
            promiseResolve = UnsafeVarTo<RecyclableObject>(resolveVar);

            // 5. Let iteratorRecord be GetIterator(iterable).
            // 6. IfAbruptRejectPromise(iteratorRecord, promiseCapability).
            Var iterable = args.Info.Count > 1 ? args[1] : library->GetUndefined();
            iteratorRecord = JavascriptOperators::GetIterator(iterable, scriptContext); 
        }
        catch (const JavascriptException& err)
        {
            JavascriptExceptionObject* exception = err.GetAndClear();
            return JavascriptPromise::CreateRejectedPromise(exception->GetThrownObject(scriptContext), scriptContext);
        }

        // Abstract operation PerformPromiseAny
        // 7. Let result be PerformPromiseAny(iteratorRecord, C, promiseCapability, promiseResolve).
        try {
            // 1. Assert: ! IsConstructor(constructor) is true. 
            // 2. Assert: resultCapability is a PromiseCapability Record.
            // 3. Assert: ! IsCallable(promiseResolve) is true.
            // 4. Let errors be a new empty List.
            JavascriptArray* errors = library->CreateArray();

            // 5. Let remainingElementsCount be a new Record { [[Value]]: 1 }.
            JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper);
            remainingElementsWrapper->remainingElements = 1;

            // 6. Let index be 0.
            uint32 index = 0;

            // 7. Repeat,
            JavascriptOperators::DoIteratorStepAndValue(iteratorRecord, scriptContext, [&](Var nextValue) {
                // a. Let next be IteratorStep(iteratorRecord).
                // e. Let nextValue be IteratorValue(next).
                // h. Append undefined to errors.
                errors->DirectAppendItem(library->GetUndefined());

                // i. Let nextPromise be ? Call(promiseResolve, constructor, << nextValue >> ).
                ThreadContext* threadContext = scriptContext->GetThreadContext();
                Var nextPromise = nullptr;
                BEGIN_SAFE_REENTRANT_CALL(threadContext);
                {
                    nextPromise = CALL_FUNCTION(threadContext,
                        promiseResolve, Js::CallInfo(CallFlags_Value, 2),
                        constructor,
                        nextValue);
                }
                END_SAFE_REENTRANT_CALL;


                JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
                alreadyCalledWrapper->alreadyResolved = false;

                // j. Let steps be the algorithm steps defined in Promise.any Reject Element Functions.
                // k. Let rejectElement be ! CreateBuiltinFunction(steps, << [[AlreadyCalled]], [[Index]], [[Errors]], [[Capability]], [[RemainingElements]] >> ).
                // p. Set rejectElement.[[RemainingElements]] to remainingElementsCount.
                Var rejectElement = library->CreatePromiseAnyRejectElementFunction(EntryAnyRejectElementFunction, index, errors, promiseCapability, remainingElementsWrapper, alreadyCalledWrapper);

                // q. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] + 1.
                remainingElementsWrapper->remainingElements++;

                // r. Perform ? Invoke(nextPromise, "then", << resultCapability.[[Resolve]], rejectElement >> ).
                RecyclableObject* nextPromiseObject;
                if (!JavascriptConversion::ToObject(nextPromise, scriptContext, &nextPromiseObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
                }
                Var thenVar = JavascriptOperators::GetProperty(nextPromiseObject, Js::PropertyIds::then, scriptContext);
                if (!JavascriptConversion::IsCallable(thenVar))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
                }

                RecyclableObject* thenFunc = UnsafeVarTo<RecyclableObject>(thenVar);

                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    CALL_FUNCTION(scriptContext->GetThreadContext(),
                        thenFunc, Js::CallInfo(CallFlags_Value, 3),
                        nextPromiseObject,
                        promiseCapability->GetResolve(),
                        rejectElement);
                }
                END_SAFE_REENTRANT_CALL;

                // s.Increase index by 1.
                index++;
            });

            // 7.d. If next is false, then
            // 7.d.i. Set iteratorRecord.[[Done]] to true.
            // 7.d.ii. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] - 1.
            remainingElementsWrapper->remainingElements--;
            // 7.d.iii. If remainingElementsCount.[[Value]] is 0, then
            if (remainingElementsWrapper->remainingElements == 0)
            {
                // 7.d.iii.1 Let error be a newly created AggregateError object.
                JavascriptError* pError = library->CreateAggregateError();
                JavascriptError::SetErrorsList(pError, errors, scriptContext);
                JavascriptError::SetErrorMessage(pError, JSERR_PromiseAllRejected, _u(""), scriptContext);
                JavascriptExceptionOperators::Throw(pError, scriptContext);
            }
        }
        catch (const JavascriptException& err)
        {
            // 8. If result is an abrupt completion, then
            //   a. If iteratorRecord.[[Done]] is false, set result to IteratorClose(iteratorRecord, result).
            //   b. IfAbruptRejectPromise(result, promiseCapability).
            JavascriptExceptionObject* exception = err.GetAndClear();
            TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        return promiseCapability->GetPromise();
    }